

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void setup_buffer_ref_mvs_inter
               (AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME ref_frame,BLOCK_SIZE block_size,
               buf_2d (*yv12_mb) [3])

{
  YV12_BUFFER_CONFIG *pYVar1;
  MACROBLOCKD *xd_00;
  MB_MODE_INFO_EXT *mbmi_ext_00;
  undefined1 in_CL;
  MV_REFERENCE_FRAME in_DL;
  YV12_BUFFER_CONFIG *unaff_RBX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  undefined8 in_R8;
  buf_2d *unaff_retaddr;
  MACROBLOCKD *in_stack_00000008;
  uint8_t *in_stack_00000010;
  MV_REFERENCE_FRAME in_stack_0000001f;
  YV12_BUFFER_CONFIG *yv12;
  scale_factors *sf;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  YV12_BUFFER_CONFIG *scaled_ref_frame;
  uint16_t (*in_stack_00000050) [8];
  int num_planes;
  AV1_COMMON *cm;
  undefined6 in_stack_00000068;
  undefined8 in_stack_ffffffffffffff78;
  MV_REFERENCE_FRAME ref_frame_00;
  AV1_COMMON *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  MV_REFERENCE_FRAME ref_frame_01;
  AV1_COMP *in_stack_ffffffffffffff90;
  AV1_COMMON *cm_00;
  BLOCK_SIZE block_size_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  ref_frame_00 = (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  cm_00 = &in_RDI->common;
  av1_num_planes(cm_00);
  block_size_00 = (BLOCK_SIZE)((ulong)cm_00 >> 0x38);
  pYVar1 = av1_get_scaled_ref_frame
                     (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  ref_frame_01 = (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  xd_00 = &in_RSI->e_mbd;
  mbmi_ext_00 = &in_RSI->mbmi_ext;
  get_ref_scale_factors_const(in_stack_ffffffffffffff80,ref_frame_00);
  get_ref_frame_yv12_buf((AV1_COMMON *)in_stack_ffffffffffffff90,ref_frame_01);
  if (pYVar1 == (YV12_BUFFER_CONFIG *)0x0) {
    av1_setup_pred_block
              (in_stack_00000008,unaff_retaddr,unaff_RBX,(scale_factors *)in_RDI,
               (scale_factors *)in_RSI,CONCAT13(in_DL,CONCAT12(in_CL,in_stack_ffffffffffffffe4)));
  }
  else {
    av1_setup_pred_block
              (in_stack_00000008,unaff_retaddr,unaff_RBX,(scale_factors *)in_RDI,
               (scale_factors *)in_RSI,CONCAT13(in_DL,CONCAT12(in_CL,in_stack_ffffffffffffffe4)));
  }
  av1_find_mv_refs((AV1_COMMON *)mbmi_ext,(MACROBLOCKD *)sf,(MB_MODE_INFO *)yv12,in_stack_0000001f,
                   in_stack_00000010,(CANDIDATE_MV (*) [8])in_stack_00000008,in_stack_00000050,
                   (int_mv (*) [2])cm,(int_mv *)yv12_mb,
                   (int16_t *)CONCAT17(ref_frame,CONCAT16(block_size,in_stack_00000068)));
  av1_copy_usable_ref_mv_stack_and_weight(xd_00,mbmi_ext_00,in_DL);
  av1_mv_pred(in_RDI,in_RSI,
              (uint8_t *)
              CONCAT17(in_DL,CONCAT16(in_CL,CONCAT24(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0))),
              (int)((ulong)in_R8 >> 0x20),(int)in_R8,block_size_00);
  if (pYVar1 != (YV12_BUFFER_CONFIG *)0x0) {
    av1_setup_pred_block
              (in_stack_00000008,unaff_retaddr,unaff_RBX,(scale_factors *)in_RDI,
               (scale_factors *)in_RSI,CONCAT13(in_DL,CONCAT12(in_CL,in_stack_ffffffffffffffe4)));
  }
  return;
}

Assistant:

static inline void setup_buffer_ref_mvs_inter(
    const AV1_COMP *const cpi, MACROBLOCK *x, MV_REFERENCE_FRAME ref_frame,
    BLOCK_SIZE block_size, struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE]) {
  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref_frame);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const struct scale_factors *const sf =
      get_ref_scale_factors_const(cm, ref_frame);
  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, ref_frame);
  assert(yv12 != NULL);

  if (scaled_ref_frame) {
    // Setup pred block based on scaled reference, because av1_mv_pred() doesn't
    // support scaling.
    av1_setup_pred_block(xd, yv12_mb[ref_frame], scaled_ref_frame, NULL, NULL,
                         num_planes);
  } else {
    av1_setup_pred_block(xd, yv12_mb[ref_frame], yv12, sf, sf, num_planes);
  }

  // Gets an initial list of candidate vectors from neighbours and orders them
  av1_find_mv_refs(cm, xd, mbmi, ref_frame, mbmi_ext->ref_mv_count,
                   xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                   mbmi_ext->mode_context);
  // TODO(Ravi): Populate mbmi_ext->ref_mv_stack[ref_frame][4] and
  // mbmi_ext->weight[ref_frame][4] inside av1_find_mv_refs.
  av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame);
  // Further refinement that is encode side only to test the top few candidates
  // in full and choose the best as the center point for subsequent searches.
  // The current implementation doesn't support scaling.
  av1_mv_pred(cpi, x, yv12_mb[ref_frame][0].buf, yv12_mb[ref_frame][0].stride,
              ref_frame, block_size);

  // Go back to unscaled reference.
  if (scaled_ref_frame) {
    // We had temporarily setup pred block based on scaled reference above. Go
    // back to unscaled reference now, for subsequent use.
    av1_setup_pred_block(xd, yv12_mb[ref_frame], yv12, sf, sf, num_planes);
  }
}